

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void UTF_fgets_test(char *fname)

{
  char16_t cVar1;
  int iVar2;
  FILE *__stream;
  char16_t *pcVar3;
  char16_t *pcVar4;
  byte *pbVar5;
  size_t sVar6;
  char16_t cVar7;
  long lVar8;
  char16_t *pcVar9;
  char *pcVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  long lVar13;
  ulong extraout_RDX;
  ulong uVar14;
  char16_t *pcVar15;
  uint uVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  ulong uVar22;
  ulong in_R8;
  ulong in_R9;
  byte bVar23;
  char16_t *pcVar24;
  byte *pbVar25;
  bool bVar26;
  bool bVar27;
  UTF_UC16 buf [64];
  UTF_C8 buf2 [128];
  undefined8 uStack_130;
  char16_t local_128 [63];
  undefined2 local_aa;
  byte local_a8 [127];
  byte local_29 [9];
  char16_t *pcVar16;
  char16_t *pcVar17;
  
  pcVar24 = local_128;
  pcVar4 = local_128;
  pcVar9 = local_128;
  pcVar15 = local_128;
  pcVar11 = local_128;
  pcVar16 = local_128;
  pcVar12 = local_128;
  pcVar17 = local_128;
  uStack_130 = 0x10265a;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    UTF_test(0x5a,false);
    return;
  }
  uStack_130 = 0x10266d;
  iVar2 = feof(__stream);
  if (iVar2 == 0) {
    uStack_130 = 0x1026f9;
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_00102671;
    sVar20 = 1;
    do {
      if (*(short *)((long)&uStack_130 + sVar20 * 2 + 6) == 10) {
        if ((sVar20 == 1) || (*(short *)((long)&uStack_130 + sVar20 * 2 + 4) != 0xd)) {
          if (sVar20 == 0x40) {
            sVar20 = sVar20 - 1;
          }
          local_128[sVar20] = L'\0';
          sVar21 = sVar20;
        }
        else {
          *(undefined4 *)((long)&uStack_130 + sVar20 * 2 + 4) = 10;
          sVar21 = sVar20;
        }
        break;
      }
      bVar26 = sVar20 != sVar6;
      sVar21 = sVar6;
      sVar20 = sVar20 + 1;
    } while (bVar26);
    if (sVar21 == 0x40) {
      local_aa = 0;
      sVar21 = 0x3f;
LAB_00103392:
      if (sVar21 - sVar6 != 0) {
        uStack_130 = 0x1033a7;
        iVar2 = fseek(__stream,(sVar21 - sVar6) * 2,1);
        if (iVar2 != 0) goto LAB_00102671;
      }
    }
    else {
      if (sVar21 != sVar6) goto LAB_00103392;
      local_128[sVar6] = L'\0';
    }
    pcVar3 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar3 = local_128;
    }
  }
  else {
LAB_00102671:
    pcVar3 = (char16_t *)(undefined1 *)0x0;
  }
  uStack_130 = 0x102686;
  UTF_test(0x5e,pcVar3 == local_128);
  pcVar3 = L"TEST\n";
  cVar7 = local_128[0];
  while (cVar7 != L'\0') {
    pcVar4 = pcVar4 + 1;
    if (*pcVar3 == L'\0') {
      pcVar3 = L"";
      goto LAB_00102734;
    }
    if (cVar7 != *pcVar3) {
      bVar26 = false;
      goto LAB_0010273e;
    }
    pcVar3 = pcVar3 + 1;
    cVar7 = *pcVar4;
  }
  cVar7 = L'\0';
LAB_00102734:
  bVar26 = cVar7 == *pcVar3;
LAB_0010273e:
  uVar19 = (ulong)bVar26;
  uVar22 = 0x5f;
  uStack_130 = 0x10274b;
  UTF_test(0x5f,bVar26);
  pbVar25 = local_29;
  if (local_128[0] == L'\0') {
    pcVar4 = local_128 + 1;
LAB_0010278a:
    lVar8 = 0;
    do {
      cVar7 = *pcVar9;
      bVar23 = (byte)cVar7;
      pbVar5 = pbVar25;
      if ((cVar7 & 0xfc00U) == 0xd800) {
        pcVar9 = pcVar9 + 1;
        if (pcVar9 == pcVar4) {
          if (lVar8 != 0x7f) {
            local_a8[lVar8] = 0x3f;
            pbVar5 = local_a8 + lVar8 + 1;
          }
          goto LAB_0010293a;
        }
        cVar1 = *pcVar9;
        if (((ushort)cVar1 & 0xfc00) == 0xdc00) {
          uVar18 = (uint)(ushort)cVar7 * 0x400 + (uint)(ushort)cVar1 + 0xfca02400;
          uVar19 = (ulong)(byte)((byte)(uVar18 >> 0x12) | 0xf0);
          in_R8 = (ulong)((byte)(uVar18 >> 0xc) & 0x3f | 0x80);
          uVar22 = (ulong)((byte)(uVar18 >> 6) & 0x3f | 0x80);
          in_R9 = (ulong)((byte)cVar1 & 0x3f | 0x80);
        }
        else if (cVar1 == L'\0') goto LAB_0010285a;
LAB_00102881:
        if (lVar8 == 0x7f) goto LAB_0010293a;
        lVar13 = lVar8 + 1;
        local_a8[lVar8] = (byte)uVar19;
        if ((byte)in_R8 == 0) {
          in_R8 = 0;
        }
        else {
          if (lVar13 == 0x7f) goto LAB_0010293a;
          lVar13 = lVar8 + 2;
          local_a8[lVar8 + 1] = (byte)in_R8;
          if ((byte)uVar22 == 0) {
            uVar22 = 0;
          }
          else {
            if (lVar13 == 0x7f) goto LAB_0010293a;
            lVar13 = lVar8 + 3;
            local_a8[lVar8 + 2] = (byte)uVar22;
            if ((byte)in_R9 == 0) {
              in_R9 = 0;
            }
            else {
              if (lVar13 == 0x7f) goto LAB_0010293a;
              local_a8[lVar8 + 3] = (byte)in_R9;
              lVar13 = lVar8 + 4;
            }
          }
        }
      }
      else {
        if (0x7f < (ushort)cVar7) {
          if ((ushort)cVar7 < 0x800) {
            uVar19 = (ulong)(byte)((byte)((ushort)cVar7 >> 6) | 0xc0);
            in_R8 = (ulong)(bVar23 & 0x3f | 0x80);
            uVar22 = 0;
          }
          else {
LAB_0010285a:
            uVar19 = (ulong)(byte)((byte)((ushort)cVar7 >> 0xc) | 0xe0);
            in_R8 = (ulong)((byte)((ushort)cVar7 >> 6) & 0x3f | 0x80);
            uVar22 = (ulong)(bVar23 & 0x3f | 0x80);
            in_R9 = 0;
          }
          goto LAB_00102881;
        }
        if (lVar8 == 0x7f) goto LAB_0010293a;
        local_a8[lVar8] = bVar23;
        lVar13 = lVar8 + 1;
        in_R8 = 0;
        uVar19 = (ulong)(uint)(ushort)cVar7;
      }
      pcVar9 = pcVar9 + 1;
      lVar8 = lVar13;
    } while (pcVar9 != pcVar4);
    pbVar5 = local_a8 + lVar13;
  }
  else {
    lVar8 = -1;
    pcVar4 = local_128 + 1;
    do {
      lVar8 = lVar8 + -1;
      cVar7 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar7 != L'\0');
    if (lVar8 != 0) goto LAB_0010278a;
    pbVar5 = local_a8;
  }
LAB_0010293a:
  *pbVar5 = 0;
  if (local_a8[0] == 0) {
    pcVar10 = "TEST\n";
    bVar23 = 0;
  }
  else {
    pcVar10 = "";
    lVar8 = 0;
    bVar23 = local_a8[0];
    do {
      lVar13 = lVar8;
      if (lVar13 == 5) goto LAB_00102984;
      if (bVar23 != "TEST\n"[lVar13]) {
        bVar26 = false;
        goto LAB_0010298d;
      }
      bVar23 = local_a8[lVar13 + 1];
      lVar8 = lVar13 + 1;
    } while (bVar23 != 0);
    pcVar10 = "TEST\n" + lVar13 + 1;
    bVar23 = 0;
  }
LAB_00102984:
  bVar26 = bVar23 == *pcVar10;
LAB_0010298d:
  uStack_130 = 0x10299a;
  UTF_test(0x61,bVar26);
  uStack_130 = 0x1029a2;
  iVar2 = feof(__stream);
  if (iVar2 == 0) {
    uStack_130 = 0x102a0d;
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_001029a6;
    sVar20 = 1;
    do {
      if (*(short *)((long)&uStack_130 + sVar20 * 2 + 6) == 10) {
        if ((sVar20 == 1) || (*(short *)((long)&uStack_130 + sVar20 * 2 + 4) != 0xd)) {
          if (sVar20 == 0x40) {
            sVar20 = sVar20 - 1;
          }
          local_128[sVar20] = L'\0';
          sVar21 = sVar20;
        }
        else {
          *(undefined4 *)((long)&uStack_130 + sVar20 * 2 + 4) = 10;
          sVar21 = sVar20;
        }
        break;
      }
      bVar26 = sVar20 != sVar6;
      sVar21 = sVar6;
      sVar20 = sVar20 + 1;
    } while (bVar26);
    if (sVar21 == 0x40) {
      local_aa = 0;
      sVar21 = 0x3f;
LAB_001033f2:
      if (sVar21 - sVar6 != 0) {
        uStack_130 = 0x103407;
        iVar2 = fseek(__stream,(sVar21 - sVar6) * 2,1);
        if (iVar2 != 0) goto LAB_001029a6;
      }
    }
    else {
      if (sVar21 != sVar6) goto LAB_001033f2;
      local_128[sVar6] = L'\0';
    }
    pcVar4 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar4 = local_128;
    }
  }
  else {
LAB_001029a6:
    pcVar4 = (char16_t *)(undefined1 *)0x0;
  }
  uStack_130 = 0x1029bb;
  UTF_test(99,pcVar4 == local_128);
  pcVar4 = L"ABC123\n";
  cVar7 = local_128[0];
  while (cVar7 != L'\0') {
    pcVar15 = pcVar15 + 1;
    if (*pcVar4 == L'\0') {
      pcVar4 = L"";
      goto LAB_00102a44;
    }
    if (cVar7 != *pcVar4) {
      bVar26 = false;
      goto LAB_00102a4e;
    }
    pcVar4 = pcVar4 + 1;
    cVar7 = *pcVar15;
  }
  cVar7 = L'\0';
LAB_00102a44:
  bVar26 = cVar7 == *pcVar4;
LAB_00102a4e:
  uVar19 = (ulong)bVar26;
  uVar22 = 100;
  uStack_130 = 0x102a5b;
  UTF_test(100,bVar26);
  if (local_128[0] == L'\0') {
    pcVar4 = local_128 + 1;
LAB_00102a92:
    lVar8 = 0;
    do {
      cVar7 = *pcVar11;
      bVar23 = (byte)cVar7;
      pbVar5 = pbVar25;
      if ((cVar7 & 0xfc00U) == 0xd800) {
        pcVar11 = pcVar11 + 1;
        if (pcVar11 == pcVar4) {
          if (lVar8 != 0x7f) {
            local_a8[lVar8] = 0x3f;
            pbVar5 = local_a8 + lVar8 + 1;
          }
          goto LAB_00102c0d;
        }
        cVar1 = *pcVar11;
        if (((ushort)cVar1 & 0xfc00) == 0xdc00) {
          uVar18 = (uint)(ushort)cVar7 * 0x400 + (uint)(ushort)cVar1 + 0xfca02400;
          uVar19 = (ulong)(byte)((byte)(uVar18 >> 0x12) | 0xf0);
          in_R8 = (ulong)((byte)(uVar18 >> 0xc) & 0x3f | 0x80);
          uVar22 = (ulong)((byte)(uVar18 >> 6) & 0x3f | 0x80);
          in_R9 = (ulong)((byte)cVar1 & 0x3f | 0x80);
        }
        else if (cVar1 == L'\0') goto LAB_00102b62;
LAB_00102b89:
        if (lVar8 == 0x7f) goto LAB_00102c0d;
        lVar13 = lVar8 + 1;
        local_a8[lVar8] = (byte)uVar19;
        if ((byte)in_R8 == 0) {
          in_R8 = 0;
        }
        else {
          if (lVar13 == 0x7f) goto LAB_00102c0d;
          lVar13 = lVar8 + 2;
          local_a8[lVar8 + 1] = (byte)in_R8;
          if ((byte)uVar22 == 0) {
            uVar22 = 0;
          }
          else {
            if (lVar13 == 0x7f) goto LAB_00102c0d;
            lVar13 = lVar8 + 3;
            local_a8[lVar8 + 2] = (byte)uVar22;
            if ((byte)in_R9 == 0) {
              in_R9 = 0;
            }
            else {
              if (lVar13 == 0x7f) goto LAB_00102c0d;
              local_a8[lVar8 + 3] = (byte)in_R9;
              lVar13 = lVar8 + 4;
            }
          }
        }
      }
      else {
        if (0x7f < (ushort)cVar7) {
          if ((ushort)cVar7 < 0x800) {
            uVar19 = (ulong)(byte)((byte)((ushort)cVar7 >> 6) | 0xc0);
            in_R8 = (ulong)(bVar23 & 0x3f | 0x80);
            uVar22 = 0;
          }
          else {
LAB_00102b62:
            uVar19 = (ulong)(byte)((byte)((ushort)cVar7 >> 0xc) | 0xe0);
            in_R8 = (ulong)((byte)((ushort)cVar7 >> 6) & 0x3f | 0x80);
            uVar22 = (ulong)(bVar23 & 0x3f | 0x80);
            in_R9 = 0;
          }
          goto LAB_00102b89;
        }
        if (lVar8 == 0x7f) goto LAB_00102c0d;
        local_a8[lVar8] = bVar23;
        lVar13 = lVar8 + 1;
        in_R8 = 0;
        uVar19 = (ulong)(uint)(ushort)cVar7;
      }
      pcVar11 = pcVar11 + 1;
      lVar8 = lVar13;
    } while (pcVar11 != pcVar4);
    pbVar5 = local_a8 + lVar13;
  }
  else {
    lVar8 = -1;
    pcVar4 = local_128 + 1;
    do {
      lVar8 = lVar8 + -1;
      cVar7 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar7 != L'\0');
    if (lVar8 != 0) goto LAB_00102a92;
    pbVar5 = local_a8;
  }
LAB_00102c0d:
  *pbVar5 = 0;
  if (local_a8[0] == 0) {
    pcVar10 = "ABC123\n";
    bVar23 = 0;
  }
  else {
    pcVar10 = "";
    lVar8 = 0;
    bVar23 = local_a8[0];
    do {
      lVar13 = lVar8;
      if (lVar13 == 7) goto LAB_00102c57;
      if (bVar23 != "ABC123\n"[lVar13]) {
        bVar26 = false;
        goto LAB_00102c60;
      }
      bVar23 = local_a8[lVar13 + 1];
      lVar8 = lVar13 + 1;
    } while (bVar23 != 0);
    pcVar10 = "ABC123\n" + lVar13 + 1;
    bVar23 = 0;
  }
LAB_00102c57:
  bVar26 = bVar23 == *pcVar10;
LAB_00102c60:
  uStack_130 = 0x102c6d;
  UTF_test(0x66,bVar26);
  uStack_130 = 0x102c75;
  iVar2 = feof(__stream);
  if (iVar2 == 0) {
    uStack_130 = 0x102ce0;
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_00102c79;
    sVar20 = 1;
    do {
      if (*(short *)((long)&uStack_130 + sVar20 * 2 + 6) == 10) {
        if ((sVar20 == 1) || (*(short *)((long)&uStack_130 + sVar20 * 2 + 4) != 0xd)) {
          if (sVar20 == 0x40) {
            sVar20 = sVar20 - 1;
          }
          local_128[sVar20] = L'\0';
          sVar21 = sVar20;
        }
        else {
          *(undefined4 *)((long)&uStack_130 + sVar20 * 2 + 4) = 10;
          sVar21 = sVar20;
        }
        break;
      }
      bVar26 = sVar20 != sVar6;
      sVar21 = sVar6;
      sVar20 = sVar20 + 1;
    } while (bVar26);
    if (sVar21 == 0x40) {
      local_aa = 0;
      sVar21 = 0x3f;
LAB_00103452:
      if (sVar21 - sVar6 != 0) {
        uStack_130 = 0x103467;
        iVar2 = fseek(__stream,(sVar21 - sVar6) * 2,1);
        if (iVar2 != 0) goto LAB_00102c79;
      }
    }
    else {
      if (sVar21 != sVar6) goto LAB_00103452;
      local_128[sVar6] = L'\0';
    }
    pcVar4 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar4 = local_128;
    }
  }
  else {
LAB_00102c79:
    pcVar4 = (char16_t *)(undefined1 *)0x0;
  }
  uStack_130 = 0x102c8e;
  UTF_test(0x68,pcVar4 == local_128);
  pcVar4 = L"あいうえお\n";
  cVar7 = local_128[0];
  while (cVar7 != L'\0') {
    pcVar16 = pcVar16 + 1;
    if (*pcVar4 == L'\0') {
      pcVar4 = L"";
      goto LAB_00102d17;
    }
    if (cVar7 != *pcVar4) {
      bVar26 = false;
      goto LAB_00102d21;
    }
    pcVar4 = pcVar4 + 1;
    cVar7 = *pcVar16;
  }
  cVar7 = L'\0';
LAB_00102d17:
  bVar26 = cVar7 == *pcVar4;
LAB_00102d21:
  uVar19 = (ulong)bVar26;
  uVar22 = 0x69;
  uStack_130 = 0x102d2e;
  UTF_test(0x69,bVar26);
  if (local_128[0] == L'\0') {
    pcVar4 = local_128 + 1;
LAB_00102d65:
    lVar8 = 0;
    do {
      cVar7 = *pcVar12;
      bVar23 = (byte)cVar7;
      pbVar5 = pbVar25;
      if ((cVar7 & 0xfc00U) == 0xd800) {
        pcVar12 = pcVar12 + 1;
        if (pcVar12 == pcVar4) {
          if (lVar8 != 0x7f) {
            local_a8[lVar8] = 0x3f;
            pbVar5 = local_a8 + lVar8 + 1;
          }
          goto LAB_00102ee0;
        }
        cVar1 = *pcVar12;
        if (((ushort)cVar1 & 0xfc00) == 0xdc00) {
          uVar18 = (uint)(ushort)cVar7 * 0x400 + (uint)(ushort)cVar1 + 0xfca02400;
          uVar19 = (ulong)(byte)((byte)(uVar18 >> 0x12) | 0xf0);
          in_R8 = (ulong)((byte)(uVar18 >> 0xc) & 0x3f | 0x80);
          uVar22 = (ulong)((byte)(uVar18 >> 6) & 0x3f | 0x80);
          in_R9 = (ulong)((byte)cVar1 & 0x3f | 0x80);
        }
        else if (cVar1 == L'\0') goto LAB_00102e35;
LAB_00102e5c:
        if (lVar8 == 0x7f) goto LAB_00102ee0;
        lVar13 = lVar8 + 1;
        local_a8[lVar8] = (byte)uVar19;
        if ((byte)in_R8 == 0) {
          in_R8 = 0;
        }
        else {
          if (lVar13 == 0x7f) goto LAB_00102ee0;
          lVar13 = lVar8 + 2;
          local_a8[lVar8 + 1] = (byte)in_R8;
          if ((byte)uVar22 == 0) {
            uVar22 = 0;
          }
          else {
            if (lVar13 == 0x7f) goto LAB_00102ee0;
            lVar13 = lVar8 + 3;
            local_a8[lVar8 + 2] = (byte)uVar22;
            if ((byte)in_R9 == 0) {
              in_R9 = 0;
            }
            else {
              if (lVar13 == 0x7f) goto LAB_00102ee0;
              local_a8[lVar8 + 3] = (byte)in_R9;
              lVar13 = lVar8 + 4;
            }
          }
        }
      }
      else {
        if (0x7f < (ushort)cVar7) {
          if ((ushort)cVar7 < 0x800) {
            uVar19 = (ulong)(byte)((byte)((ushort)cVar7 >> 6) | 0xc0);
            in_R8 = (ulong)(bVar23 & 0x3f | 0x80);
            uVar22 = 0;
          }
          else {
LAB_00102e35:
            uVar19 = (ulong)(byte)((byte)((ushort)cVar7 >> 0xc) | 0xe0);
            in_R8 = (ulong)((byte)((ushort)cVar7 >> 6) & 0x3f | 0x80);
            uVar22 = (ulong)(bVar23 & 0x3f | 0x80);
            in_R9 = 0;
          }
          goto LAB_00102e5c;
        }
        if (lVar8 == 0x7f) goto LAB_00102ee0;
        local_a8[lVar8] = bVar23;
        lVar13 = lVar8 + 1;
        in_R8 = 0;
        uVar19 = (ulong)(uint)(ushort)cVar7;
      }
      pcVar12 = pcVar12 + 1;
      lVar8 = lVar13;
    } while (pcVar12 != pcVar4);
    pbVar5 = local_a8 + lVar13;
  }
  else {
    lVar8 = -1;
    pcVar4 = local_128 + 1;
    do {
      lVar8 = lVar8 + -1;
      cVar7 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar7 != L'\0');
    if (lVar8 != 0) goto LAB_00102d65;
    pbVar5 = local_a8;
  }
LAB_00102ee0:
  *pbVar5 = 0;
  if (local_a8[0] == 0) {
    pcVar10 = anon_var_dwarf_5af3;
    bVar23 = 0;
  }
  else {
    pcVar10 = anon_var_dwarf_5af3 + 0x10;
    lVar8 = 0;
    bVar23 = local_a8[0];
    do {
      lVar13 = lVar8;
      if (lVar13 == 0x10) goto LAB_00102f2a;
      if (bVar23 != anon_var_dwarf_5af3[lVar13]) {
        bVar26 = false;
        goto LAB_00102f33;
      }
      bVar23 = local_a8[lVar13 + 1];
      lVar8 = lVar13 + 1;
    } while (bVar23 != 0);
    pcVar10 = anon_var_dwarf_5af3 + lVar13 + 1;
    bVar23 = 0;
  }
LAB_00102f2a:
  bVar26 = bVar23 == *pcVar10;
LAB_00102f33:
  uStack_130 = 0x102f40;
  UTF_test(0x6b,bVar26);
  uStack_130 = 0x102f48;
  iVar2 = feof(__stream);
  if (iVar2 == 0) {
    uStack_130 = 0x102fb3;
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_00102f4c;
    sVar20 = 1;
    do {
      if (*(short *)((long)&uStack_130 + sVar20 * 2 + 6) == 10) {
        if ((sVar20 == 1) || (*(short *)((long)&uStack_130 + sVar20 * 2 + 4) != 0xd)) {
          if (sVar20 == 0x40) {
            sVar20 = sVar20 - 1;
          }
          local_128[sVar20] = L'\0';
          sVar21 = sVar20;
        }
        else {
          *(undefined4 *)((long)&uStack_130 + sVar20 * 2 + 4) = 10;
          sVar21 = sVar20;
        }
        break;
      }
      bVar26 = sVar20 != sVar6;
      sVar21 = sVar6;
      sVar20 = sVar20 + 1;
    } while (bVar26);
    if (sVar21 == 0x40) {
      local_aa = 0;
      sVar21 = 0x3f;
LAB_001034b2:
      if (sVar21 - sVar6 != 0) {
        uStack_130 = 0x1034c7;
        iVar2 = fseek(__stream,(sVar21 - sVar6) * 2,1);
        if (iVar2 != 0) goto LAB_00102f4c;
      }
    }
    else {
      if (sVar21 != sVar6) goto LAB_001034b2;
      local_128[sVar6] = L'\0';
    }
    pcVar4 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar4 = local_128;
    }
  }
  else {
LAB_00102f4c:
    pcVar4 = (char16_t *)(undefined1 *)0x0;
  }
  uStack_130 = 0x102f61;
  UTF_test(0x6d,pcVar4 == local_128);
  pcVar4 = L"漢字\n";
  cVar7 = local_128[0];
  while (cVar7 != L'\0') {
    pcVar17 = pcVar17 + 1;
    if (*pcVar4 == L'\0') {
      pcVar4 = L"";
      goto LAB_00102fea;
    }
    if (cVar7 != *pcVar4) {
      bVar26 = false;
      goto LAB_00102ff4;
    }
    pcVar4 = pcVar4 + 1;
    cVar7 = *pcVar17;
  }
  cVar7 = L'\0';
LAB_00102fea:
  bVar26 = cVar7 == *pcVar4;
LAB_00102ff4:
  uVar19 = (ulong)bVar26;
  uVar22 = 0x6e;
  uStack_130 = 0x103001;
  UTF_test(0x6e,bVar26);
  if (local_128[0] == L'\0') {
    pcVar4 = local_128 + 1;
LAB_00103038:
    lVar8 = 0;
    uVar14 = extraout_RDX;
    do {
      cVar7 = *pcVar24;
      bVar23 = (byte)cVar7;
      if ((cVar7 & 0xfc00U) == 0xd800) {
        pcVar24 = pcVar24 + 1;
        if (pcVar24 == pcVar4) {
          if (lVar8 != 0x7f) {
            local_a8[lVar8] = 0x3f;
            pbVar25 = local_a8 + lVar8 + 1;
          }
          goto LAB_0010327f;
        }
        cVar1 = *pcVar24;
        if ((cVar1 & 0xfc00U) == 0xdc00) {
          uVar18 = (uint)(ushort)cVar7 * 0x400 + (uint)(ushort)cVar1 + 0xfca02400;
          uVar14 = (ulong)(uVar18 >> 0x12) | 0xf0;
          uVar22 = (ulong)((byte)(uVar18 >> 0xc) & 0x3f | 0x80);
          uVar19 = (ulong)((byte)(uVar18 >> 6) & 0x3f | 0x80);
          in_R8 = (ulong)((byte)cVar1 & 0x3f | 0x80);
        }
        else if (cVar1 == L'\0') goto LAB_00103102;
LAB_00103127:
        if (lVar8 == 0x7f) goto LAB_0010327f;
        lVar13 = lVar8 + 1;
        local_a8[lVar8] = (byte)uVar14;
        if ((byte)uVar22 == 0) {
          uVar22 = 0;
        }
        else {
          if (lVar13 == 0x7f) goto LAB_0010327f;
          lVar13 = lVar8 + 2;
          local_a8[lVar8 + 1] = (byte)uVar22;
          if ((byte)uVar19 == 0) {
            uVar19 = 0;
          }
          else {
            if (lVar13 == 0x7f) goto LAB_0010327f;
            lVar13 = lVar8 + 3;
            local_a8[lVar8 + 2] = (byte)uVar19;
            if ((byte)in_R8 == 0) {
              in_R8 = 0;
            }
            else {
              if (lVar13 == 0x7f) goto LAB_0010327f;
              local_a8[lVar8 + 3] = (byte)in_R8;
              lVar13 = lVar8 + 4;
            }
          }
        }
      }
      else {
        if (0x7f < (ushort)cVar7) {
          if ((ushort)cVar7 < 0x800) {
            uVar14 = (ulong)((ushort)cVar7 >> 6 & 0xff) | 0xc0;
            uVar22 = (ulong)(bVar23 & 0x3f | 0x80);
            uVar19 = 0;
          }
          else {
LAB_00103102:
            uVar14 = (ulong)((ushort)cVar7 >> 0xc) | 0xe0;
            uVar22 = (ulong)((byte)((ushort)cVar7 >> 6) & 0x3f | 0x80);
            uVar19 = (ulong)(bVar23 & 0x3f | 0x80);
            in_R8 = 0;
          }
          goto LAB_00103127;
        }
        if (lVar8 == 0x7f) goto LAB_0010327f;
        local_a8[lVar8] = bVar23;
        lVar13 = lVar8 + 1;
        uVar22 = 0;
        uVar14 = (ulong)(ushort)cVar7;
      }
      pcVar24 = pcVar24 + 1;
      lVar8 = lVar13;
    } while (pcVar24 != pcVar4);
    pbVar25 = local_a8 + lVar13;
  }
  else {
    lVar8 = -1;
    pcVar4 = local_128 + 1;
    do {
      lVar8 = lVar8 + -1;
      cVar7 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar7 != L'\0');
    if (lVar8 != 0) goto LAB_00103038;
    pbVar25 = local_a8;
  }
LAB_0010327f:
  *pbVar25 = 0;
  if (local_a8[0] == 0) {
    pcVar10 = anon_var_dwarf_5b1f;
    local_a8[0] = 0;
  }
  else {
    pcVar10 = anon_var_dwarf_5b1f + 7;
    lVar8 = 0;
    do {
      lVar13 = lVar8;
      if (lVar13 == 7) goto LAB_001032ca;
      if (local_a8[0] != anon_var_dwarf_5b1f[lVar13]) {
        bVar26 = false;
        goto LAB_001032d3;
      }
      local_a8[0] = local_a8[lVar13 + 1];
      lVar8 = lVar13 + 1;
    } while (local_a8[0] != 0);
    pcVar10 = anon_var_dwarf_5b1f + lVar13 + 1;
    local_a8[0] = 0;
  }
LAB_001032ca:
  bVar26 = local_a8[0] == *pcVar10;
LAB_001032d3:
  uStack_130 = 0x1032e0;
  UTF_test(0x70,bVar26);
  uStack_130 = 0x1032e8;
  iVar2 = feof(__stream);
  bVar26 = true;
  if (iVar2 != 0) goto LAB_00103534;
  uStack_130 = 0x103308;
  sVar6 = fread(local_128,2,0x40,__stream);
  if (sVar6 == 0) goto LAB_00103534;
  sVar20 = 1;
  do {
    if (*(short *)((long)&uStack_130 + sVar20 * 2 + 6) == 10) {
      if ((sVar20 == 1) || (*(short *)((long)&uStack_130 + sVar20 * 2 + 4) != 0xd)) {
        if (sVar20 == 0x40) {
          sVar20 = sVar20 - 1;
        }
        local_128[sVar20] = L'\0';
        sVar21 = sVar20;
      }
      else {
        *(undefined4 *)((long)&uStack_130 + sVar20 * 2 + 4) = 10;
        sVar21 = sVar20;
      }
      break;
    }
    bVar27 = sVar20 != sVar6;
    sVar21 = sVar6;
    sVar20 = sVar20 + 1;
  } while (bVar27);
  if (sVar21 == 0x40) {
    local_aa = 0;
    sVar21 = 0x3f;
LAB_00103512:
    if (sVar21 - sVar6 != 0) {
      uStack_130 = 0x103527;
      iVar2 = fseek(__stream,(sVar21 - sVar6) * 2,1);
      if (iVar2 != 0) goto LAB_00103534;
    }
  }
  else {
    if (sVar21 != sVar6) goto LAB_00103512;
    local_128[sVar6] = L'\0';
  }
  bVar26 = local_128[0] == L'\0';
LAB_00103534:
  uStack_130 = 0x103542;
  UTF_test(0x72,bVar26);
  uStack_130 = 0x10354a;
  fclose(__stream);
  return;
}

Assistant:

void UTF_fgets_test(const char *fname)
{
    FILE *fp;
    UTF_UC16 buf[64];
    UTF_C8 buf2[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("TEST\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("TEST\n")) == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("ABC123\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("ABC123\n")) == 0);

    UTF_test(__LINE__, UTF16_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u3042\u3044\u3046\u3048\u304A\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE3\x81\x82\xE3\x81\x84\xE3\x81\x86\xE3\x81\x88\xE3\x81\x8A\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u6F22\u5B57\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE6\xBC\xA2\xE5\xAD\x97\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == NULL);

    fclose(fp);
}